

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cc
# Opt level: O3

base_learner * binary_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  base_learner *l;
  single_learner *base;
  learner<char,_example> *plVar2;
  bool binary;
  option_group_definition new_options;
  bool local_161;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  string local_140;
  option_group_definition local_120;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [112];
  bool local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  local_161 = false;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Binary loss","");
  paVar1 = &local_120.m_name.field_2;
  local_120.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,local_e8,local_e8 + local_e0);
  local_120.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"binary","");
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_c8,&local_140,&local_161)
  ;
  local_58 = true;
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_160,"report loss as binary classification on -1,1","");
  std::__cxx11::string::_M_assign((string *)(local_c8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&local_120,(typed_option<bool> *)local_c8);
  if (local_160[0] != local_150) {
    operator_delete(local_160[0]);
  }
  local_c8._0_8_ = &PTR__typed_option_002d60f0;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_120);
  if (local_161 == false) {
    plVar2 = (learner<char,_example> *)0x0;
  }
  else {
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::learner<char,example>::init_learner<LEARNER::learner<char,example>>
                       ((char *)0x0,base,predict_or_learn<true>,predict_or_learn<false>,1,
                        *(prediction_type_t *)(base + 0xd0));
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_120.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_120.m_name._M_dataplus._M_p);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* binary_setup(options_i& options, vw& all)
{
  bool binary = false;
  option_group_definition new_options("Binary loss");
  new_options.add(make_option("binary", binary).keep().help("report loss as binary classification on -1,1"));
  options.add_and_parse(new_options);

  if (!binary)
    return nullptr;

  LEARNER::learner<char, example>& ret =
      LEARNER::init_learner(as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  return make_base(ret);
}